

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

bool __thiscall miniros::Subscription::negotiateConnection(Subscription *this,string *xmlrpc_uri)

{
  bool bVar1;
  element_type *this_00;
  string *psVar2;
  mapped_type *pmVar3;
  undefined8 uVar4;
  long *plVar5;
  element_type *peVar6;
  ASyncXMLRPCConnectionPtr *conn_00;
  Subscription *in_RDI;
  scoped_lock<std::mutex> pending_connections_lock;
  PendingConnectionPtr conn;
  bool enabled_3;
  bool enabled_2;
  XmlRpcClient *c;
  bool enabled_1;
  uint32_t peer_port;
  string peer_host;
  bool enabled;
  XmlRpcValue v;
  uint32_t len;
  shared_ptr<unsigned_char[]> buffer;
  M_string m;
  int max_datagram_size;
  string *transport;
  iterator __end1;
  iterator __begin1;
  V_string *__range1;
  V_string transports;
  int protos;
  TransportUDPPtr udp_transport;
  XmlRpcValue udpros_array;
  XmlRpcValue params;
  XmlRpcValue protos_array;
  XmlRpcValue tcpros_array;
  char *in_stack_fffffffffffffa78;
  TransportHints *in_stack_fffffffffffffa80;
  LogLocation *in_stack_fffffffffffffa90;
  undefined7 in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffa9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  Level LVar7;
  Subscription *in_stack_fffffffffffffaa8;
  LogLocation *in_stack_fffffffffffffab0;
  key_type *in_stack_fffffffffffffab8;
  RPCManager *in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac8;
  Level LVar8;
  undefined4 in_stack_fffffffffffffacc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffad0;
  TransportHints *in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffae0;
  int in_stack_fffffffffffffae4;
  XmlRpcClient *in_stack_fffffffffffffae8;
  XmlRpcClient *in_stack_fffffffffffffaf0;
  void *pvVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  void *in_stack_fffffffffffffb60;
  Level in_stack_fffffffffffffb68;
  uint in_stack_fffffffffffffb6c;
  uint uVar10;
  XmlRpcValue *in_stack_fffffffffffffbb8;
  string *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbc8;
  allocator<char> local_349;
  string local_348 [38];
  undefined1 local_322;
  allocator<char> local_321;
  string local_320 [32];
  long *local_300;
  undefined4 local_2f8;
  undefined1 local_2f2;
  allocator<char> local_2f1;
  string local_2f0 [36];
  undefined4 local_2cc;
  string local_2c8 [70];
  char local_282;
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [52];
  int local_224;
  undefined1 local_1fc [4];
  __shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> local_1f8;
  allocator<char> local_1e1;
  string local_1e0 [32];
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [32];
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [32];
  undefined1 local_108 [48];
  PollSet *local_d8;
  int local_bc;
  reference local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  undefined1 *local_a0;
  undefined1 local_98 [28];
  int local_7c;
  __shared_ptr local_78 [16];
  XmlRpcValue local_68;
  XmlRpcValue local_58 [2];
  XmlRpcValue local_38;
  XmlRpcValue local_28 [2];
  byte local_1;
  
  XmlRpc::XmlRpcValue::XmlRpcValue(local_28);
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_38);
  XmlRpc::XmlRpcValue::XmlRpcValue(local_58);
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_68);
  std::shared_ptr<miniros::TransportUDP>::shared_ptr((shared_ptr<miniros::TransportUDP> *)0x4d1c8e);
  local_7c = 0;
  TransportHints::getTransports_abi_cxx11_(&in_RDI->transport_hints_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffad0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffa90);
  if (bVar1) {
    TransportHints::reliable(in_stack_fffffffffffffa80);
    TransportHints::getTransports_abi_cxx11_(&in_RDI->transport_hints_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                in_stack_fffffffffffffb18);
  }
  local_a0 = local_98;
  local_a8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffa78);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffa78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffa80,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffa78), bVar1) {
    local_b8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_a8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    if (bVar1) {
      local_bc = TransportHints::getMaxDatagramSize(in_stack_fffffffffffffad8);
      PollManager::instance();
      this_00 = std::
                __shared_ptr_access<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4d1e8f);
      local_d8 = PollManager::getPollSet(this_00);
      std::make_shared<miniros::TransportUDP,miniros::PollSet*>
                ((PollSet **)in_stack_fffffffffffffaa8);
      std::shared_ptr<miniros::TransportUDP>::operator=
                ((shared_ptr<miniros::TransportUDP> *)in_stack_fffffffffffffa80,
                 (shared_ptr<miniros::TransportUDP> *)in_stack_fffffffffffffa78);
      std::shared_ptr<miniros::TransportUDP>::~shared_ptr
                ((shared_ptr<miniros::TransportUDP> *)0x4d1eea);
      if (local_bc == 0) {
        peVar6 = std::
                 __shared_ptr_access<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4d1f01);
        local_bc = TransportUDP::getMaxDatagramSize(peVar6);
      }
      std::__shared_ptr_access<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4d1f2d);
      TransportUDP::createIncoming
                ((TransportUDP *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                 (int)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffb60 >> 0x18,0));
      XmlRpc::XmlRpcValue::operator[]
                ((XmlRpcValue *)in_stack_fffffffffffffa80,
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      XmlRpc::XmlRpcValue::operator=
                ((XmlRpcValue *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                 (char *)in_stack_fffffffffffffad8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x4d1f77);
      psVar2 = getName_abi_cxx11_(in_RDI);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffac0->uri_,(char *)in_stack_fffffffffffffab8,
                 (allocator<char> *)in_stack_fffffffffffffab0);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)psVar2);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator(&local_129);
      md5sum_abi_cxx11_(in_stack_fffffffffffffaa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffac0->uri_,(char *)in_stack_fffffffffffffab8,
                 (allocator<char> *)in_stack_fffffffffffffab0);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      std::__cxx11::string::operator=((string *)pmVar3,local_150);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator(&local_171);
      std::__cxx11::string::~string(local_150);
      psVar2 = this_node::getName_abi_cxx11_();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffac0->uri_,(char *)in_stack_fffffffffffffab8,
                 (allocator<char> *)in_stack_fffffffffffffab0);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)psVar2);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator(&local_199);
      datatype_abi_cxx11_((Subscription *)in_stack_fffffffffffffa78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffac0->uri_,(char *)in_stack_fffffffffffffab8,
                 (allocator<char> *)in_stack_fffffffffffffab0);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      std::__cxx11::string::operator=((string *)pmVar3,local_1c0);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      std::__cxx11::string::~string(local_1c0);
      std::shared_ptr<unsigned_char[]>::shared_ptr((shared_ptr<unsigned_char[]> *)0x4d2204);
      Header::write((int)local_108,&local_1f8,(size_t)local_1fc);
      std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get(&local_1f8);
      XmlRpc::XmlRpcValue::XmlRpcValue
                ((XmlRpcValue *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                 (int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
      in_stack_fffffffffffffbc8 =
           (string *)
           XmlRpc::XmlRpcValue::operator[]
                     ((XmlRpcValue *)in_stack_fffffffffffffa80,
                      (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      XmlRpc::XmlRpcValue::operator=
                ((XmlRpcValue *)in_stack_fffffffffffffac0,(XmlRpcValue *)in_stack_fffffffffffffab8);
      in_stack_fffffffffffffbc0 = network::getHost_abi_cxx11_();
      XmlRpc::XmlRpcValue::XmlRpcValue
                ((XmlRpcValue *)in_stack_fffffffffffffaa0,
                 (string *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
      in_stack_fffffffffffffbb8 =
           XmlRpc::XmlRpcValue::operator[]
                     ((XmlRpcValue *)in_stack_fffffffffffffa80,
                      (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      XmlRpc::XmlRpcValue::operator=
                ((XmlRpcValue *)in_stack_fffffffffffffac0,(XmlRpcValue *)in_stack_fffffffffffffab8);
      XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4d22e2);
      peVar6 = std::
               __shared_ptr_access<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4d22ef);
      local_224 = TransportUDP::getServerPort(peVar6);
      XmlRpc::XmlRpcValue::operator[]
                ((XmlRpcValue *)in_stack_fffffffffffffa80,
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      XmlRpc::XmlRpcValue::operator=
                ((XmlRpcValue *)in_stack_fffffffffffffab0,(int *)in_stack_fffffffffffffaa8);
      XmlRpc::XmlRpcValue::operator[]
                ((XmlRpcValue *)in_stack_fffffffffffffa80,
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      XmlRpc::XmlRpcValue::operator=
                ((XmlRpcValue *)in_stack_fffffffffffffab0,(int *)in_stack_fffffffffffffaa8);
      local_7c = local_7c + 1;
      XmlRpc::XmlRpcValue::operator[]
                ((XmlRpcValue *)in_stack_fffffffffffffa80,
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      XmlRpc::XmlRpcValue::operator=
                ((XmlRpcValue *)in_stack_fffffffffffffac0,(XmlRpcValue *)in_stack_fffffffffffffab8);
      XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4d23c1);
      std::shared_ptr<unsigned_char[]>::~shared_ptr((shared_ptr<unsigned_char[]> *)0x4d23ce);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x4d23db);
      uVar10 = in_stack_fffffffffffffb6c;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (&in_stack_fffffffffffffac0->uri_,(char *)in_stack_fffffffffffffab8,
                   (allocator<char> *)in_stack_fffffffffffffab0);
        XmlRpc::XmlRpcValue::XmlRpcValue
                  ((XmlRpcValue *)in_stack_fffffffffffffaa0,
                   (string *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
        XmlRpc::XmlRpcValue::operator[]
                  ((XmlRpcValue *)in_stack_fffffffffffffa80,
                   (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
        XmlRpc::XmlRpcValue::operator=
                  ((XmlRpcValue *)in_stack_fffffffffffffac0,(XmlRpcValue *)in_stack_fffffffffffffab8
                  );
        XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4d2661);
        std::__cxx11::string::~string(local_258);
        std::allocator<char>::~allocator(&local_259);
        local_7c = local_7c + 1;
        XmlRpc::XmlRpcValue::operator[]
                  ((XmlRpcValue *)in_stack_fffffffffffffa80,
                   (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
        XmlRpc::XmlRpcValue::operator=
                  ((XmlRpcValue *)in_stack_fffffffffffffac0,(XmlRpcValue *)in_stack_fffffffffffffab8
                  );
        uVar10 = in_stack_fffffffffffffb6c;
      }
      else {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((negotiateConnection::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (&in_stack_fffffffffffffac0->uri_,(char *)in_stack_fffffffffffffab8,
                     (allocator<char> *)in_stack_fffffffffffffab0);
          console::initializeLogLocation
                    (in_stack_fffffffffffffab0,(string *)in_stack_fffffffffffffaa8,
                     (Level)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
          std::__cxx11::string::~string(local_280);
          std::allocator<char>::~allocator(&local_281);
        }
        if (negotiateConnection::loc.level_ != Warn) {
          console::setLogLocationLevel
                    ((LogLocation *)in_stack_fffffffffffffa80,
                     (Level)((ulong)in_stack_fffffffffffffa78 >> 0x20));
          console::checkLogLocationEnabled(in_stack_fffffffffffffa90);
        }
        uVar10 = in_stack_fffffffffffffb6c & 0xffffff;
        if ((negotiateConnection::loc.logger_enabled_ & 1U) != 0) {
          uVar10 = CONCAT13(1,(int3)in_stack_fffffffffffffb6c);
        }
        local_282 = (char)(uVar10 >> 0x18);
        if (local_282 != '\0') {
          in_stack_fffffffffffffb60 = negotiateConnection::loc.logger_;
          in_stack_fffffffffffffb68 = negotiateConnection::loc.level_;
          in_stack_fffffffffffffa80 = (TransportHints *)std::__cxx11::string::c_str();
          in_stack_fffffffffffffa78 = "Unsupported transport type hinted: %s, skipping";
          console::print((FilterBase *)0x0,in_stack_fffffffffffffb60,
                         (Level)(ulong)in_stack_fffffffffffffb68,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x183,
                         "bool miniros::Subscription::negotiateConnection(const std::string &)");
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_a8);
    in_stack_fffffffffffffb6c = uVar10;
  }
  this_node::getName_abi_cxx11_();
  XmlRpc::XmlRpcValue::XmlRpcValue
            ((XmlRpcValue *)in_stack_fffffffffffffaa0,
             (string *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  XmlRpc::XmlRpcValue::operator[]
            ((XmlRpcValue *)in_stack_fffffffffffffa80,
             (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
  XmlRpc::XmlRpcValue::operator=
            ((XmlRpcValue *)in_stack_fffffffffffffac0,(XmlRpcValue *)in_stack_fffffffffffffab8);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4d2961);
  XmlRpc::XmlRpcValue::XmlRpcValue
            ((XmlRpcValue *)in_stack_fffffffffffffaa0,
             (string *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  XmlRpc::XmlRpcValue::operator[]
            ((XmlRpcValue *)in_stack_fffffffffffffa80,
             (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
  XmlRpc::XmlRpcValue::operator=
            ((XmlRpcValue *)in_stack_fffffffffffffac0,(XmlRpcValue *)in_stack_fffffffffffffab8);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4d29bc);
  XmlRpc::XmlRpcValue::operator[]
            ((XmlRpcValue *)in_stack_fffffffffffffa80,
             (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
  XmlRpc::XmlRpcValue::operator=
            ((XmlRpcValue *)in_stack_fffffffffffffac0,(XmlRpcValue *)in_stack_fffffffffffffab8);
  std::__cxx11::string::string(local_2c8);
  bVar1 = network::splitURI(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                            &in_stack_fffffffffffffbb8->_type);
  if (bVar1) {
    plVar5 = (long *)operator_new(0xf8);
    std::__cxx11::string::c_str();
    XmlRpc::XmlRpcClient::XmlRpcClient
              (in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae4
               ,(char *)in_stack_fffffffffffffad8);
    local_300 = plVar5;
    bVar1 = XmlRpc::XmlRpcClient::executeNonBlock
                      (in_stack_fffffffffffffae8,
                       (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                       (XmlRpcValue *)in_stack_fffffffffffffad8);
    if (bVar1) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((negotiateConnection(std::__cxx11::string_const&)::loc.initialized_ ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (&in_stack_fffffffffffffac0->uri_,(char *)in_stack_fffffffffffffab8,
                   (allocator<char> *)in_stack_fffffffffffffab0);
        console::initializeLogLocation
                  (in_stack_fffffffffffffab0,(string *)in_stack_fffffffffffffaa8,
                   (Level)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
        std::__cxx11::string::~string(local_348);
        std::allocator<char>::~allocator(&local_349);
      }
      if (negotiateConnection(std::__cxx11::string_const&)::loc.level_ != Debug) {
        console::setLogLocationLevel
                  ((LogLocation *)in_stack_fffffffffffffa80,
                   (Level)((ulong)in_stack_fffffffffffffa78 >> 0x20));
        console::checkLogLocationEnabled(in_stack_fffffffffffffa90);
      }
      if ((negotiateConnection(std::__cxx11::string_const&)::loc.logger_enabled_ & 1U) != 0) {
        in_stack_fffffffffffffac0 =
             (RPCManager *)negotiateConnection(std::__cxx11::string_const&)::loc.logger_;
        LVar8 = negotiateConnection(std::__cxx11::string_const&)::loc.level_;
        in_stack_fffffffffffffa80 = (TransportHints *)std::__cxx11::string::c_str();
        in_stack_fffffffffffffa78 = "Began asynchronous xmlrpc connection to [%s:%d]";
        console::print((FilterBase *)0x0,in_stack_fffffffffffffac0,(Level)(ulong)LVar8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                       ,0x1a3,"bool miniros::Subscription::negotiateConnection(const std::string &)"
                       ,"Began asynchronous xmlrpc connection to [%s:%d]",in_stack_fffffffffffffa80,
                       local_2cc);
      }
      std::enable_shared_from_this<miniros::Subscription>::shared_from_this
                ((enable_shared_from_this<miniros::Subscription> *)in_stack_fffffffffffffa78);
      std::
      make_shared<miniros::Subscription::PendingConnection,XmlRpc::XmlRpcClient*&,std::shared_ptr<miniros::TransportUDP>&,std::shared_ptr<miniros::Subscription>,std::__cxx11::string_const&>
                ((XmlRpcClient **)in_stack_fffffffffffffab8,
                 (shared_ptr<miniros::TransportUDP> *)in_stack_fffffffffffffab0,
                 (shared_ptr<miniros::Subscription> *)in_stack_fffffffffffffaa8,
                 in_stack_fffffffffffffaa0);
      std::shared_ptr<miniros::Subscription>::~shared_ptr
                ((shared_ptr<miniros::Subscription> *)0x4d3167);
      conn_00 = (ASyncXMLRPCConnectionPtr *)RPCManager::instance();
      std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4d317d);
      std::shared_ptr<miniros::ASyncXMLRPCConnection>::
      shared_ptr<miniros::Subscription::PendingConnection,void>
                ((shared_ptr<miniros::ASyncXMLRPCConnection> *)in_stack_fffffffffffffa80,
                 (shared_ptr<miniros::Subscription::PendingConnection> *)in_stack_fffffffffffffa78);
      RPCManager::addASyncConnection(in_stack_fffffffffffffac0,conn_00);
      std::shared_ptr<miniros::ASyncXMLRPCConnection>::~shared_ptr
                ((shared_ptr<miniros::ASyncXMLRPCConnection> *)0x4d31ba);
      std::scoped_lock<std::mutex>::scoped_lock
                ((scoped_lock<std::mutex> *)in_stack_fffffffffffffa80,
                 (mutex_type *)in_stack_fffffffffffffa78);
      std::
      set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
      ::insert((set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
                *)in_stack_fffffffffffffaa0,
               (value_type *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
      std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d3224);
      local_1 = 1;
      local_2f8 = 1;
      std::shared_ptr<miniros::Subscription::PendingConnection>::~shared_ptr
                ((shared_ptr<miniros::Subscription::PendingConnection> *)0x4d3244);
    }
    else {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      LVar7 = (Level)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
      LVar8 = (Level)((ulong)in_stack_fffffffffffffa78 >> 0x20);
      if (((negotiateConnection(std::__cxx11::string_const&)::loc.initialized_ ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (&in_stack_fffffffffffffac0->uri_,(char *)in_stack_fffffffffffffab8,
                   (allocator<char> *)in_stack_fffffffffffffab0);
        console::initializeLogLocation
                  (in_stack_fffffffffffffab0,(string *)in_stack_fffffffffffffaa8,LVar7);
        std::__cxx11::string::~string(local_320);
        std::allocator<char>::~allocator(&local_321);
      }
      if (negotiateConnection(std::__cxx11::string_const&)::loc.level_ != Debug) {
        console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffa80,LVar8);
        console::checkLogLocationEnabled(in_stack_fffffffffffffa90);
      }
      LVar8 = negotiateConnection(std::__cxx11::string_const&)::loc.level_;
      local_322 = (negotiateConnection(std::__cxx11::string_const&)::loc.logger_enabled_ & 1U) != 0;
      if ((bool)local_322) {
        pvVar9 = negotiateConnection(std::__cxx11::string_const&)::loc.logger_;
        uVar4 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffa90 = (LogLocation *)std::__cxx11::string::c_str();
        console::print((FilterBase *)0x0,pvVar9,(Level)(ulong)LVar8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                       ,0x199,"bool miniros::Subscription::negotiateConnection(const std::string &)"
                       ,"Failed to contact publisher [%s:%d] for topic [%s]",uVar4,local_2cc);
      }
      if (local_300 != (long *)0x0) {
        (**(code **)(*local_300 + 8))();
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_78);
      if (bVar1) {
        peVar6 = std::
                 __shared_ptr_access<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4d2f45);
        (*(peVar6->super_Transport)._vptr_Transport[8])();
      }
      local_1 = 0;
      local_2f8 = 1;
    }
  }
  else {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    LVar7 = (Level)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
    LVar8 = (Level)((ulong)in_stack_fffffffffffffa78 >> 0x20);
    if (((negotiateConnection(std::__cxx11::string_const&)::loc.initialized_ ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffac0->uri_,(char *)in_stack_fffffffffffffab8,
                 (allocator<char> *)in_stack_fffffffffffffab0);
      console::initializeLogLocation
                (in_stack_fffffffffffffab0,(string *)in_stack_fffffffffffffaa8,LVar7);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
    }
    if (negotiateConnection(std::__cxx11::string_const&)::loc.level_ != Error) {
      console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffa80,LVar8);
      console::checkLogLocationEnabled(in_stack_fffffffffffffa90);
    }
    local_2f2 = (negotiateConnection(std::__cxx11::string_const&)::loc.logger_enabled_ & 1U) != 0;
    if ((bool)local_2f2) {
      pvVar9 = negotiateConnection(std::__cxx11::string_const&)::loc.logger_;
      LVar8 = negotiateConnection(std::__cxx11::string_const&)::loc.level_;
      uVar4 = std::__cxx11::string::c_str();
      console::print((FilterBase *)0x0,pvVar9,(Level)(ulong)LVar8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                     ,0x18d,"bool miniros::Subscription::negotiateConnection(const std::string &)",
                     "Bad xml-rpc URI: [%s]",uVar4);
    }
    local_1 = 0;
    local_2f8 = 1;
  }
  std::__cxx11::string::~string(local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa90);
  std::shared_ptr<miniros::TransportUDP>::~shared_ptr((shared_ptr<miniros::TransportUDP> *)0x4d32ff)
  ;
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4d330c);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4d3319);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4d3326);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4d3333);
  return (bool)(local_1 & 1);
}

Assistant:

bool Subscription::negotiateConnection(const std::string& xmlrpc_uri)
{
  XmlRpcValue tcpros_array, protos_array, params;
  XmlRpcValue udpros_array;
  TransportUDPPtr udp_transport;
  int protos = 0;
  V_string transports = transport_hints_.getTransports();
  if (transports.empty())
  {
    transport_hints_.reliable();
    transports = transport_hints_.getTransports();
  }
  for (const std::string& transport: transports)
  {
    if (transport == "UDP")
    {
      int max_datagram_size = transport_hints_.getMaxDatagramSize();
      udp_transport = std::make_shared<TransportUDP>(&PollManager::instance()->getPollSet());
      if (!max_datagram_size)
        max_datagram_size = udp_transport->getMaxDatagramSize();
      udp_transport->createIncoming(0, false);
      udpros_array[0] = "UDPROS";
      M_string m;
      m["topic"] = getName();
      m["md5sum"] = md5sum();
      m["callerid"] = this_node::getName();
      m["type"] = datatype();
      std::shared_ptr<uint8_t[]> buffer;
      uint32_t len;
      Header::write(m, buffer, len);
      XmlRpcValue v(buffer.get(), len);
      udpros_array[1] = v;
      udpros_array[2] = network::getHost();
      udpros_array[3] = udp_transport->getServerPort();
      udpros_array[4] = max_datagram_size;

      protos_array[protos++] = udpros_array;
    }
    else if (transport == "TCP")
    {
      tcpros_array[0] = std::string("TCPROS");
      protos_array[protos++] = tcpros_array;
    }
    else
    {
      MINIROS_WARN("Unsupported transport type hinted: %s, skipping", transport.c_str());
    }
  }
  params[0] = this_node::getName();
  params[1] = name_;
  params[2] = protos_array;
  std::string peer_host;
  uint32_t peer_port;
  if (!network::splitURI(xmlrpc_uri, peer_host, peer_port))
  {
    MINIROS_ERROR("Bad xml-rpc URI: [%s]", xmlrpc_uri.c_str());
    return false;
  }

  XmlRpc::XmlRpcClient* c = new XmlRpc::XmlRpcClient(peer_host.c_str(),
                                                     peer_port, "/");
 // if (!c.execute("requestTopic", params, result) || !g_node->validateXmlrpcResponse("requestTopic", result, proto))

  // Initiate the negotiation.  We'll come back and check on it later.
  if (!c->executeNonBlock("requestTopic", params))
  {
    MINIROS_DEBUG("Failed to contact publisher [%s:%d] for topic [%s]",
              peer_host.c_str(), peer_port, name_.c_str());
    delete c;
    if (udp_transport)
    {
      udp_transport->close();
    }

    return false;
  }

  MINIROS_DEBUG("Began asynchronous xmlrpc connection to [%s:%d]", peer_host.c_str(), peer_port);

  // The PendingConnectionPtr takes ownership of c, and will delete it on
  // destruction.
  PendingConnectionPtr conn(std::make_shared<PendingConnection>(c, udp_transport, shared_from_this(), xmlrpc_uri));

  RPCManager::instance()->addASyncConnection(conn);
  // Put this connection on the list that we'll look at later.
  {
    std::scoped_lock<std::mutex> pending_connections_lock(pending_connections_mutex_);
    pending_connections_.insert(conn);
  }

  return true;
}